

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::Data
          (Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *this,
          Data<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  undefined8 uVar3;
  anon_struct_24_1_898a9ca8_for_storage *paVar4;
  ulong uVar5;
  Node<std::pair<QFontEngine_*,_int>,_QGlyphRun> *pNVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  R RVar10;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar8 = other->numBuckets;
  sVar9 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar9;
  this->spans = (Span *)0x0;
  RVar10 = allocateSpans(sVar8);
  this->spans = (Span *)RVar10.spans;
  if (RVar10.nSpans != 0) {
    lVar7 = 0;
    sVar8 = 0;
    do {
      pSVar1 = other->spans;
      sVar9 = 0;
      do {
        uVar5 = (ulong)pSVar1->offsets[sVar9 + lVar7];
        if (uVar5 != 0xff) {
          pEVar2 = pSVar1[sVar8].entries;
          pNVar6 = Span<QHashPrivate::Node<std::pair<QFontEngine_*,_int>,_QGlyphRun>_>::insert
                             (this->spans + sVar8,sVar9);
          paVar4 = &pEVar2[uVar5].storage;
          uVar3 = *(undefined8 *)(paVar4->data + 8);
          (pNVar6->key).first = *(QFontEngine **)paVar4->data;
          *(undefined8 *)&(pNVar6->key).second = uVar3;
          QGlyphRun::QGlyphRun(&pNVar6->value,(QGlyphRun *)(paVar4->data + 0x10));
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != 0x80);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (sVar8 != RVar10.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }